

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O1

rotations_t *
opengv::relative_pose::sixpt
          (rotations_t *__return_storage_ptr__,RelativeAdapterBase *adapter,Indices *indices)

{
  double dVar1;
  double dVar2;
  rotations_t *prVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  size_t sVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  Matrix<double,_6,_6,_0,_6,_6> L2;
  Matrix<double,_6,_6,_0,_6,_6> L1;
  double local_338;
  double local_330;
  double local_328;
  double local_320;
  double dStack_318;
  double local_310;
  undefined1 local_308 [16];
  double local_2f8;
  undefined1 local_2f0 [16];
  double local_2e0;
  undefined1 local_2d0 [16];
  rotations_t *local_2c0;
  double local_2b8;
  undefined1 local_2b0 [16];
  Matrix<double,_6,_6,_0,_6,_6> local_2a0;
  Matrix<double,_6,_6,_0,_6,_6> local_180;
  
  local_2b8 = (double)indices->_numberCorrespondences;
  local_2c0 = __return_storage_ptr__;
  if (local_2b8 != 0.0) {
    lVar9 = 0x28;
    lVar6 = 0;
    sVar8 = 0;
    do {
      iVar7 = (int)sVar8;
      lVar5 = lVar6 >> 0x1e;
      iVar4 = iVar7;
      if (indices->_useIndices != false) {
        iVar4 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar5);
      }
      (*adapter->_vptr_RelativeAdapterBase[6])(&local_320,adapter,(long)iVar4);
      iVar4 = iVar7;
      if (indices->_useIndices != false) {
        iVar4 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar5);
      }
      (*adapter->_vptr_RelativeAdapterBase[2])(&local_338,adapter,(long)iVar4);
      auVar22._0_8_ = local_338 * local_320;
      auVar22._8_8_ = local_338 * dStack_318;
      auVar12._8_8_ = local_330;
      auVar12._0_8_ = local_330;
      auVar12 = vfmadd231pd_fma(auVar22,auVar12,local_308);
      auVar18._8_8_ = local_328;
      auVar18._0_8_ = local_328;
      local_2b0 = vfmadd231pd_fma(auVar12,auVar18,local_2f0);
      dVar1 = local_338 * local_310;
      local_2d0._0_8_ = local_330 * local_2f8;
      dVar2 = local_328 * local_2e0;
      iVar4 = iVar7;
      if (indices->_useIndices != false) {
        iVar4 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar5);
      }
      (*adapter->_vptr_RelativeAdapterBase[8])(&local_320,adapter,(long)iVar4);
      iVar4 = iVar7;
      if (indices->_useIndices != false) {
        iVar4 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar5);
      }
      dVar1 = dVar2 + (double)local_2d0._0_8_ + dVar1;
      (*adapter->_vptr_RelativeAdapterBase[3])(&local_338,adapter,(long)iVar4);
      auVar23._0_8_ = local_338 * local_320;
      auVar23._8_8_ = local_338 * dStack_318;
      auVar13._8_8_ = local_330;
      auVar13._0_8_ = local_330;
      auVar12 = vfmadd231pd_fma(auVar23,auVar13,local_308);
      auVar19._8_8_ = local_328;
      auVar19._0_8_ = local_328;
      local_2d0 = vfmadd231pd_fma(auVar12,auVar19,local_2f0);
      dVar2 = local_338 * local_310 + local_330 * local_2f8 + local_328 * local_2e0;
      *(undefined8 *)
       ((long)local_180.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array + lVar9 + -0x28) = local_2b0._0_8_;
      *(undefined8 *)
       ((long)local_180.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array + lVar9 + -0x20) = local_2b0._8_8_;
      *(double *)
       ((long)local_180.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array + lVar9 + -0x18) = dVar1;
      *(undefined1 (*) [16])(local_2d0 + lVar9 + 8) = local_2d0;
      *(double *)(local_2b0 + lVar9 + -8) = dVar2;
      iVar4 = iVar7;
      if (indices->_useIndices != false) {
        iVar4 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar5);
      }
      (*adapter->_vptr_RelativeAdapterBase[5])(&local_320,adapter,(long)iVar4);
      auVar12 = vshufpd_avx(local_2b0,local_2b0,1);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_310;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_320;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dStack_318;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar1;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dStack_318 * dVar1;
      auVar18 = vfmsub231sd_fma(auVar26,auVar12,auVar14);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_310 * local_2b0._0_8_;
      auVar22 = vfmsub231sd_fma(auVar15,auVar20,auVar28);
      auVar18 = vunpcklpd_avx(auVar18,auVar22);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_320 * auVar12._0_8_;
      auVar12 = vfmsub231sd_fma(auVar10,local_2b0,auVar24);
      *(undefined1 (*) [16])
       ((long)local_180.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array + lVar9 + -0x10) = auVar18;
      *(long *)((long)local_180.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                      m_storage.m_data.array + lVar9) = auVar12._0_8_;
      if (indices->_useIndices != false) {
        iVar7 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar5);
      }
      (*adapter->_vptr_RelativeAdapterBase[7])(&local_320,adapter,(long)iVar7);
      auVar12 = vshufpd_avx(local_2d0,local_2d0,1);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_310;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_320;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dStack_318;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = dVar2;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dStack_318 * dVar2;
      auVar18 = vfmsub231sd_fma(auVar27,auVar12,auVar16);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_310 * local_2d0._0_8_;
      auVar22 = vfmsub231sd_fma(auVar17,auVar21,auVar29);
      auVar18 = vunpcklpd_avx(auVar18,auVar22);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_320 * auVar12._0_8_;
      auVar12 = vfmsub231sd_fma(auVar11,local_2d0,auVar25);
      *(undefined1 (*) [16])(local_2b0 + lVar9) = auVar18;
      *(long *)((long)local_2a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                      m_storage.m_data.array + lVar9) = auVar12._0_8_;
      sVar8 = sVar8 + 1;
      lVar9 = lVar9 + 0x30;
      lVar6 = lVar6 + 0x100000000;
    } while (local_2b8 != (double)sVar8);
  }
  prVar3 = local_2c0;
  (local_2c0->
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_2c0->
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_2c0->
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  modules::sixpt_main(&local_180,&local_2a0,local_2c0);
  return prVar3;
}

Assistant:

rotations_t sixpt(
    const RelativeAdapterBase & adapter,
    const Indices & indices )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences == 6);

  Eigen::Matrix<double,6,6> L1;
  Eigen::Matrix<double,6,6> L2;

  for(size_t i = 0; i < numberCorrespondences; i++)
  {
    bearingVector_t f1 =
        adapter.getCamRotation1(indices[i]) * adapter.getBearingVector1(indices[i]);
    bearingVector_t f2 =
        adapter.getCamRotation2(indices[i]) * adapter.getBearingVector2(indices[i]);
        
    L1.block<3,1>(0,i) = f1;
    L2.block<3,1>(0,i) = f2;
    
    L1.block<3,1>(3,i) = f1.cross(adapter.getCamOffset1(indices[i]));
    L2.block<3,1>(3,i) = f2.cross(adapter.getCamOffset2(indices[i]));
  }

  rotations_t solutions;
  modules::sixpt_main( L1, L2, solutions );  
  return solutions;
}